

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::AlignmentTests_PadCenter_Test::~AlignmentTests_PadCenter_Test
          (AlignmentTests_PadCenter_Test *this)

{
  AlignmentTests_PadCenter_Test *this_local;
  
  ~AlignmentTests_PadCenter_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AlignmentTests, PadCenter) {
  auto a = readAlignment("0-3       7-7");
  ASSERT_EQ(2, a.size());
  EXPECT_EQ(0, a.front().src);
  EXPECT_EQ(3, a.front().tgt);
  EXPECT_EQ(7, a.back().src);
  EXPECT_EQ(7, a.back().tgt);
}